

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topten.c
# Opt level: O1

void munge_xlstring(char *dest,char *src,int n)

{
  char cVar1;
  ulong uVar2;
  uint uVar3;
  char cVar4;
  
  if (n < 2) {
    uVar2 = 0;
  }
  else {
    uVar3 = n - 1;
    uVar2 = 0;
    do {
      cVar1 = src[uVar2];
      cVar4 = '_';
      if (((cVar1 != '\n') && (cVar1 != ':')) && (cVar4 = cVar1, cVar1 == '\0')) {
        uVar3 = (uint)uVar2;
        break;
      }
      dest[uVar2] = cVar4;
      uVar2 = uVar2 + 1;
    } while (uVar3 != uVar2);
    uVar2 = (ulong)uVar3;
  }
  dest[uVar2] = '\0';
  return;
}

Assistant:

void munge_xlstring(char *dest, const char *src, int n)
{
    int i;

    for (i = 0; i < n - 1 && src[i]; i++) {
	if (src[i] == SEPC || src[i] == '\n') {
	    dest[i] = '_';
	} else {
	    dest[i] = src[i];
	}
    }

    dest[i] = '\0';
}